

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O1

void Acec_StatsCollect(Gia_Man_t *p,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  char **ppcVar10;
  void *__s;
  Vec_Wrd_t *vTemp;
  word *__s_00;
  word wVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int *__s_01;
  int Map [256];
  int local_438 [258];
  
  __s = (void *)0x0;
  ppcVar10 = Kit_DsdNpn4ClassNames();
  __s_01 = local_438;
  memset(__s_01,0,0x400);
  iVar9 = p->nObjs;
  lVar12 = (long)iVar9;
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  if (iVar8 != 0) {
    __s = malloc((long)iVar8 * 8);
  }
  memset(__s,0,lVar12 * 8);
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = iVar8;
  if (iVar8 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar8 << 3);
  }
  vTemp->pArray = __s_00;
  vTemp->nSize = iVar9;
  memset(__s_00,0,lVar12 * 8);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x165,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  iVar8 = Gia_ManLutSizeMax(p);
  if (3 < iVar8) {
    __assert_fail("Gia_ManLutSizeMax(p) < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                  ,0x166,"void Acec_StatsCollect(Gia_Man_t *, int)");
  }
  if (1 < p->nObjs) {
    lVar13 = 1;
    do {
      if (p->vMapping->nSize <= lVar13) goto LAB_006756a2;
      if (p->vMapping->pArray[lVar13] != 0) {
        wVar11 = Gia_ObjComputeTruthTable6Lut(p,(int)lVar13,vTemp);
        if (lVar12 <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        *(word *)((long)__s + lVar13 * 8) = wVar11;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < p->nObjs);
  }
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (word *)0x0;
  }
  free(vTemp);
  iVar8 = p->nObjs;
  if (1 < (long)iVar8) {
    pVVar6 = p->vMapping;
    uVar16 = pVVar6->nSize;
    uVar14 = 1;
    if (1 < (int)uVar16) {
      uVar14 = (ulong)uVar16;
    }
    uVar15 = 1;
    do {
      if (uVar15 == uVar14) {
LAB_006756a2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = pVVar6->pArray;
      uVar2 = piVar7[uVar15];
      if ((ulong)uVar2 != 0) {
        if (lVar12 <= (long)uVar15) goto LAB_006756c1;
        iVar3 = Npn3Table[*(byte *)((long)__s + uVar15 * 8)][1];
        if (0xe < iVar3) {
          __assert_fail("iTruth < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                        ,0x173,"void Acec_StatsCollect(Gia_Man_t *, int)");
        }
        if ((int)uVar16 <= (int)uVar2 || (int)uVar2 < 0) goto LAB_006756a2;
        puVar1 = (uint *)(piVar7 + uVar2);
        uVar4 = *puVar1;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        uVar17 = 0;
        while (uVar4 != uVar17) {
          uVar5 = puVar1[uVar17 + 1];
          if (((long)(int)uVar5 < 0) || (iVar9 <= (int)uVar5)) goto LAB_006756c1;
          if (0xe < Npn3Table[*(byte *)((long)__s + (long)(int)uVar5 * 8)][1]) {
            __assert_fail("iTruthF < 15",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                          ,0x178,"void Acec_StatsCollect(Gia_Man_t *, int)");
          }
          local_438[Npn3Table[*(byte *)((long)__s + (long)(int)uVar5 * 8)][1] * 0x10 + iVar3] =
               local_438[Npn3Table[*(byte *)((long)__s + (long)(int)uVar5 * 8)][1] * 0x10 + iVar3] +
               1;
          uVar17 = uVar17 + 1;
          if ((int)uVar16 <= (int)uVar2 || (int)uVar2 < 0) goto LAB_006756a2;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (long)iVar8);
  }
  lVar12 = (long)p->vCos->nSize;
  if (0 < lVar12) {
    piVar7 = p->vCos->pArray;
    lVar13 = 0;
    do {
      iVar3 = piVar7[lVar13];
      if (((long)iVar3 < 0) || (iVar8 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar16 = iVar3 - (*(uint *)(p->pObjs + iVar3) & 0x1fffffff);
      if (((int)uVar16 < 0) || (iVar9 <= (int)uVar16)) {
LAB_006756c1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (0xe < Npn3Table[*(byte *)((long)__s + (ulong)uVar16 * 8)][1]) {
        __assert_fail("iTruthF < 15",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                      ,0x180,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
      local_438[Npn3Table[*(byte *)((long)__s + (ulong)uVar16 * 8)][1] << 4] =
           local_438[Npn3Table[*(byte *)((long)__s + (ulong)uVar16 * 8)][1] << 4] + 1;
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("fi / fo");
  uVar16 = 0;
  do {
    printf("%6d ",(ulong)uVar16);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xe);
  putchar(10);
  uVar14 = 0;
  do {
    printf("%6d ",uVar14 & 0xffffffff);
    lVar12 = 0;
    do {
      if (__s_01[lVar12] == 0) {
        printf("%6s ",".");
      }
      else {
        printf("%6d ");
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0xe);
    putchar(10);
    uVar14 = uVar14 + 1;
    __s_01 = __s_01 + 0x10;
  } while (uVar14 != 0xe);
  puts("\nClasses:");
  uVar16 = 0;
  do {
    lVar12 = 0;
    while (Npn3Table[lVar12][1] != uVar16) {
      lVar12 = lVar12 + 1;
      if (lVar12 == 0x100) {
        __assert_fail("k < 256",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecSt.c"
                      ,0x19a,"void Acec_StatsCollect(Gia_Man_t *, int)");
      }
    }
    iVar9 = Dar_LibReturnClass(Npn3Table[lVar12][0] << 8 | Npn3Table[lVar12][0]);
    printf("%2d : %s\n",(ulong)uVar16,ppcVar10[iVar9]);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0xe);
  return;
}

Assistant:

void Acec_StatsCollect( Gia_Man_t * p, int fVerbose )
{
    extern int Dar_LibReturnClass( unsigned uTruth );
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();

    int Map[256] = {0};
    Vec_Wrd_t * vTruths = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    word Truth, TruthF;
    int iTruth, iTruthF;
    int iFan, iLut, i, k, Class;
    assert( Gia_ManHasMapping(p) );
    assert( Gia_ManLutSizeMax(p) < 4 );
    // collect truth tables
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Gia_ObjComputeTruthTable6Lut( p, iLut, vTemp );
        Vec_WrdWriteEntry( vTruths, iLut, Truth );
    }
    Vec_WrdFree( vTemp );
    // collect pairs
    Gia_ManForEachLut( p, iLut )
    {
        Truth = Vec_WrdEntry( vTruths, iLut ) & 0xFF;
        iTruth = Npn3Table[Truth][1];
        assert( iTruth < 15 );
        Gia_LutForEachFanin( p, iLut, iFan, k )
        {
            TruthF = Vec_WrdEntry( vTruths, iFan ) & 0xFF;
            iTruthF = Npn3Table[TruthF][1];
            assert( iTruthF < 15 );
            Map[(iTruthF << 4) + iTruth]++;
        }
    }
    Gia_ManForEachCoDriverId( p, iFan, k )
    {
        TruthF = Vec_WrdEntry( vTruths, iFan );
        iTruthF = Npn3Table[TruthF & 0xFF][1];
        assert( iTruthF < 15 );
        Map[(iTruthF << 4)]++;
    }
    Vec_WrdFree( vTruths );
    // print statistics
    printf( "fi / fo" );
    for ( i = 0; i < 14; i++ )
        printf( "%6d ", i );
    printf( "\n" );
    for ( i = 0; i < 14; i++ )
    {
        printf( "%6d ", i );
        for ( k = 0; k < 14; k++ )
            if ( Map[(i << 4) | k] )
                printf( "%6d ", Map[(i << 4) | k] );
            else
                printf( "%6s ", "." );
        printf( "\n" );
    }
    // print class formulas
    printf( "\nClasses:\n" );
    for ( i = 0; i < 14; i++ )
    {
        for ( k = 0; k < 256; k++ )
            if ( Npn3Table[k][1] == i )
                break;
        assert( k < 256 );
        Class = Dar_LibReturnClass( (Npn3Table[k][0] << 8) | Npn3Table[k][0] );
        printf( "%2d : %s\n", i, pNames[Class] );
    }
}